

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

void fio_lib_init(void)

{
  rlim_t rVar1;
  int iVar2;
  __pid_t _Var3;
  int *piVar4;
  intptr_t local_30;
  ssize_t i;
  rlim_t original;
  rlimit rlim;
  ssize_t capa;
  
  rlim.rlim_max = 0;
  rlim.rlim_max = sysconf(4);
  memset(&original,0,0x10);
  iVar2 = getrlimit(RLIMIT_NOFILE,(rlimit *)&original);
  rVar1 = original;
  if (iVar2 == -1) {
    if (2 < FIO_LOG_LEVEL) {
      FIO_LOG2STDERR("WARNING: `getrlimit` failed in `fio_lib_init`.");
    }
    perror("\terrno:");
  }
  else {
    original = rlim.rlim_cur;
    if (0x20000 < rlim.rlim_cur) {
      rlim.rlim_cur = 0x20000;
      original = rlim.rlim_cur;
    }
    while (iVar2 = setrlimit(RLIMIT_NOFILE,(rlimit *)&original), iVar2 == -1 && rVar1 < original) {
      original = original - 1;
    }
    getrlimit(RLIMIT_NOFILE,(rlimit *)&original);
    rlim.rlim_max = original;
    if (0x400 < (long)original) {
      rlim.rlim_max = original - 0x10;
    }
  }
  fio_mem_init();
  fio_poll_init();
  fio_pubsub_initialize();
  fio_data = (fio_data_s *)fio_mmap(rlim.rlim_max * 0xa8 + 0x40);
  if (fio_data == (fio_data_s *)0x0) {
    if (0 < FIO_LOG_LEVEL) {
      FIO_LOG2STDERR(
                    "FATAL: memory allocation error /workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fio.c:3623"
                    );
    }
    kill(0,2);
    piVar4 = __errno_location();
    exit(*piVar4);
  }
  fio_data->capa = (uint32_t)rlim.rlim_max;
  _Var3 = getpid();
  fio_data->parent = _Var3;
  fio_data->connection_count = 0;
  fio_mark_time();
  for (local_30 = 0; local_30 < (long)rlim.rlim_max; local_30 = local_30 + 1) {
    fio_clear_fd(local_30,'\0');
  }
  fio_state_callback_force(FIO_CALL_ON_INITIALIZE);
  fio_state_callback_clear(FIO_CALL_ON_INITIALIZE);
  return;
}

Assistant:

static void __attribute__((constructor)) fio_lib_init(void) {
  /* detect socket capacity - MUST be first...*/
  ssize_t capa = 0;
  {
#ifdef _SC_OPEN_MAX
    capa = sysconf(_SC_OPEN_MAX);
#elif defined(FOPEN_MAX)
    capa = FOPEN_MAX;
#endif
    // try to maximize limits - collect max and set to max
    struct rlimit rlim = {.rlim_max = 0};
    if (getrlimit(RLIMIT_NOFILE, &rlim) == -1) {
      FIO_LOG_WARNING("`getrlimit` failed in `fio_lib_init`.");
      perror("\terrno:");
    } else {
      rlim_t original = rlim.rlim_cur;
      rlim.rlim_cur = rlim.rlim_max;
      if (rlim.rlim_cur > FIO_MAX_SOCK_CAPACITY) {
        rlim.rlim_cur = rlim.rlim_max = FIO_MAX_SOCK_CAPACITY;
      }
      while (setrlimit(RLIMIT_NOFILE, &rlim) == -1 && rlim.rlim_cur > original)
        --rlim.rlim_cur;
      getrlimit(RLIMIT_NOFILE, &rlim);
      capa = rlim.rlim_cur;
      if (capa > 1024) /* leave a slice of room */
        capa -= 16;
    }
    /* initialize memory allocator */
    fio_mem_init();
    /* initialize polling engine */
    fio_poll_init();
    /* initialize the cluster engine */
    fio_pubsub_initialize();
#if DEBUG
#if FIO_ENGINE_POLL
    FIO_LOG_INFO("facil.io " FIO_VERSION_STRING " capacity initialization:\n"
                 "*    Meximum open files %zu out of %zu\n"
                 "*    Allocating %zu bytes for state handling.\n"
                 "*    %zu bytes per connection + %zu for state handling.",
                 capa, (size_t)rlim.rlim_max,
                 (sizeof(*fio_data) + (capa * (sizeof(*fio_data->poll))) +
                  (capa * (sizeof(*fio_data->info)))),
                 (sizeof(*fio_data->poll) + sizeof(*fio_data->info)),
                 sizeof(*fio_data));
#else
    FIO_LOG_INFO("facil.io " FIO_VERSION_STRING " capacity initialization:\n"
                 "*    Meximum open files %zu out of %zu\n"
                 "*    Allocating %zu bytes for state handling.\n"
                 "*    %zu bytes per connection + %zu for state handling.",
                 capa, (size_t)rlim.rlim_max,
                 (sizeof(*fio_data) + (capa * (sizeof(*fio_data->info)))),
                 (sizeof(*fio_data->info)), sizeof(*fio_data));
#endif
#endif
  }

#if FIO_ENGINE_POLL
  /* allocate and initialize main data structures by detected capacity */
  fio_data = fio_mmap(sizeof(*fio_data) + (capa * (sizeof(*fio_data->poll))) +
                      (capa * (sizeof(*fio_data->info))));
  FIO_ASSERT_ALLOC(fio_data);
  fio_data->capa = capa;
  fio_data->poll =
      (void *)((uintptr_t)(fio_data + 1) + (sizeof(fio_data->info[0]) * capa));
#else
  /* allocate and initialize main data structures by detected capacity */
  fio_data = fio_mmap(sizeof(*fio_data) + (capa * (sizeof(*fio_data->info))));
  FIO_ASSERT_ALLOC(fio_data);
  fio_data->capa = capa;
#endif
  fio_data->parent = getpid();
  fio_data->connection_count = 0;
  fio_mark_time();

  for (ssize_t i = 0; i < capa; ++i) {
    fio_clear_fd(i, 0);
#if FIO_ENGINE_POLL
    fio_data->poll[i].fd = -1;
#endif
  }

  /* call initialization callbacks */
  fio_state_callback_force(FIO_CALL_ON_INITIALIZE);
  fio_state_callback_clear(FIO_CALL_ON_INITIALIZE);
}